

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout.cpp
# Opt level: O0

void __thiscall
QGraphicsAnchorLayout::addAnchors
          (QGraphicsAnchorLayout *this,QGraphicsLayoutItem *firstItem,
          QGraphicsLayoutItem *secondItem,Orientations orientations)

{
  long lVar1;
  bool bVar2;
  QFlagsStorage<Qt::Orientation> QVar3;
  Int IVar4;
  QFlagsStorage<Qt::Orientation> QVar5;
  QGraphicsAnchor *pQVar6;
  undefined4 in_ECX;
  undefined8 in_RDX;
  QGraphicsLayoutItem *in_RSI;
  QFlags<Qt::Orientation> *in_RDI;
  long in_FS_OFFSET;
  bool bVar7;
  bool ok;
  Orientation in_stack_ffffffffffffffbc;
  AnchorPoint secondEdge;
  QFlags<Qt::Orientation> *pQVar8;
  AnchorPoint firstEdge;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  secondEdge = (AnchorPoint)((ulong)in_RDX >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar7 = true;
  pQVar8 = in_RDI;
  QVar3.i = (Int)QFlags<Qt::Orientation>::operator&(in_RDI,in_stack_ffffffffffffffbc);
  firstEdge = (AnchorPoint)((ulong)pQVar8 >> 0x20);
  IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xfffffffffffffff0);
  if (IVar4 != 0) {
    pQVar6 = addAnchor((QGraphicsAnchorLayout *)CONCAT44(in_ECX,QVar3.i),
                       (QGraphicsLayoutItem *)
                       CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),firstEdge,
                       in_RSI,secondEdge);
    bVar7 = pQVar6 != (QGraphicsAnchor *)0x0;
    if (bVar7) {
      addAnchor((QGraphicsAnchorLayout *)CONCAT44(in_ECX,QVar3.i),
                (QGraphicsLayoutItem *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8)
                ,firstEdge,in_RSI,secondEdge);
    }
  }
  QVar5.i = (Int)QFlags<Qt::Orientation>::operator&(in_RDI,in_stack_ffffffffffffffbc);
  IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xffffffffffffffec);
  bVar2 = false;
  if (IVar4 != 0) {
    bVar2 = bVar7;
  }
  if (bVar2) {
    addAnchor((QGraphicsAnchorLayout *)CONCAT44(in_ECX,QVar3.i),
              (QGraphicsLayoutItem *)CONCAT44(QVar5.i,in_stack_ffffffffffffffe8),firstEdge,in_RSI,
              secondEdge);
    addAnchor((QGraphicsAnchorLayout *)CONCAT44(in_ECX,QVar3.i),
              (QGraphicsLayoutItem *)CONCAT44(QVar5.i,in_stack_ffffffffffffffe8),firstEdge,in_RSI,
              secondEdge);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsAnchorLayout::addAnchors(QGraphicsLayoutItem *firstItem,
                                       QGraphicsLayoutItem *secondItem,
                                       Qt::Orientations orientations)
{
    bool ok = true;
    if (orientations & Qt::Horizontal) {
        // Currently, if the first is ok, then the rest of the calls should be ok
        ok = addAnchor(secondItem, Qt::AnchorLeft, firstItem, Qt::AnchorLeft) != nullptr;
        if (ok)
            addAnchor(firstItem, Qt::AnchorRight, secondItem, Qt::AnchorRight);
    }
    if (orientations & Qt::Vertical && ok) {
        addAnchor(secondItem, Qt::AnchorTop, firstItem, Qt::AnchorTop);
        addAnchor(firstItem, Qt::AnchorBottom, secondItem, Qt::AnchorBottom);
    }
}